

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merge_sort_tree.hpp
# Opt level: O2

void __thiscall
duckdb::MergeSortTree<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_32UL,_32UL>::BuildRun
          (MergeSortTree<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_32UL,_32UL> *this,
          idx_t level_idx,idx_t run_idx)

{
  ulong uVar1;
  pointer puVar2;
  pointer puVar3;
  value_type vVar4;
  uint uVar5;
  idx_t l;
  reference this_00;
  reference pvVar6;
  reference this_01;
  ulong uVar7;
  const_reference pvVar8;
  reference pvVar9;
  ulong uVar10;
  unsigned_long uVar11;
  RunElement *insert_val;
  ulong uVar12;
  idx_t j;
  unsigned_long uVar13;
  idx_t slot_idx;
  idx_t i;
  unsigned_long *puVar14;
  long lVar15;
  size_type sVar16;
  ulong uVar17;
  ulong uVar18;
  size_type __n;
  size_type sVar19;
  idx_t i_1;
  long lVar20;
  RunElement RVar21;
  RunElement SENTINEL;
  RunElement local_530;
  array<std::pair<unsigned_int,_unsigned_int>,_32UL> bounds;
  RunElements players;
  Games games;
  
  this_00 = vector<std::pair<duckdb::vector<unsigned_int,_true>,_duckdb::vector<unsigned_int,_true>_>,_true>
            ::get<true>(&this->tree,level_idx);
  pvVar6 = vector<std::pair<duckdb::vector<unsigned_int,_true>,_duckdb::vector<unsigned_int,_true>_>,_true>
           ::get<true>(&this->tree,level_idx);
  this_01 = vector<std::pair<duckdb::vector<unsigned_int,_true>,_duckdb::vector<unsigned_int,_true>_>,_true>
            ::get<true>(&this->tree,level_idx - 1);
  uVar7 = 1;
  uVar12 = 0x20;
  uVar18 = uVar7;
  for (; uVar10 = uVar12, uVar7 < level_idx; uVar7 = uVar7 + 1) {
    uVar12 = uVar10 << 5;
    uVar18 = uVar10;
  }
  SENTINEL.first = 0xffffffff;
  uVar7 = (long)(this_00->first).super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(this_00->first).super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start >> 2;
  SENTINEL.second = 0xffffffffffffffff;
  uVar13 = 0;
  switchD_016d4fed::default(&bounds,0,0x100);
  ::std::array<std::pair<unsigned_int,_unsigned_long>,_32UL>::array(&players);
  puVar14 = &players._M_elems[0].second;
  sVar16 = uVar10 * run_idx;
  while( true ) {
    vVar4 = 0xffffffff;
    if (uVar13 == 0x20) break;
    uVar12 = uVar7;
    if (sVar16 < uVar7) {
      uVar12 = sVar16;
    }
    uVar1 = uVar18 + sVar16;
    uVar17 = uVar7;
    if (uVar1 < uVar7) {
      uVar17 = uVar1;
    }
    bounds._M_elems[uVar13].first = (uint)uVar12;
    bounds._M_elems[uVar13].second = (uint)uVar17;
    uVar11 = 0xffffffffffffffff;
    if ((uint)uVar12 != (uint)uVar17) {
      pvVar8 = vector<unsigned_int,_true>::get<true>(&this_01->first,sVar16);
      vVar4 = *pvVar8;
      uVar11 = uVar13;
    }
    ((pair<unsigned_int,_unsigned_long> *)(puVar14 + -1))->first = vVar4;
    *puVar14 = uVar11;
    uVar13 = uVar13 + 1;
    puVar14 = puVar14 + 2;
    sVar16 = uVar1;
  }
  ::std::array<std::pair<unsigned_int,_unsigned_long>,_31UL>::array(&games);
  RVar21 = StartGames(this,&games,&players,&SENTINEL);
  sVar16 = uVar10 * run_idx;
  sVar19 = run_idx * ((uVar10 >> 5) + 2) * 0x20;
  while( true ) {
    slot_idx = RVar21.second;
    puVar2 = (pvVar6->second).super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    puVar3 = (pvVar6->second).super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if ((RVar21.first == SENTINEL.first) && (slot_idx == SENTINEL.second)) break;
    __n = sVar19;
    if ((puVar2 != puVar3) && ((sVar16 & 0x1f) == 0)) {
      for (lVar15 = 0; __n = sVar19 + lVar15, lVar15 != 0x20; lVar15 = lVar15 + 1) {
        vVar4 = bounds._M_elems[lVar15].first;
        pvVar9 = vector<unsigned_int,_true>::get<true>(&pvVar6->second,__n);
        *pvVar9 = vVar4;
      }
    }
    pvVar9 = vector<unsigned_int,_true>::get<true>(&this_00->first,sVar16);
    *pvVar9 = RVar21.first;
    uVar5 = bounds._M_elems[slot_idx].first + 1;
    bounds._M_elems[slot_idx].first = uVar5;
    if (uVar5 < bounds._M_elems[slot_idx].second) {
      pvVar8 = vector<unsigned_int,_true>::get<true>(&this_01->first,(ulong)uVar5);
      local_530.first = *pvVar8;
      insert_val = &local_530;
      local_530.second = slot_idx;
    }
    else {
      insert_val = &SENTINEL;
    }
    RVar21 = ReplayGames(this,&games,slot_idx,insert_val);
    sVar16 = sVar16 + 1;
    sVar19 = __n;
  }
  if (puVar2 != puVar3) {
    for (lVar15 = 0; lVar15 != 2; lVar15 = lVar15 + 1) {
      for (lVar20 = 0; lVar20 != 0x20; lVar20 = lVar20 + 1) {
        vVar4 = bounds._M_elems[lVar20].first;
        pvVar9 = vector<unsigned_int,_true>::get<true>(&pvVar6->second,lVar20 + sVar19);
        *pvVar9 = vVar4;
      }
      sVar19 = lVar20 + sVar19;
    }
  }
  LOCK();
  (this->build_complete).super___atomic_base<unsigned_long>._M_i =
       (this->build_complete).super___atomic_base<unsigned_long>._M_i + 1;
  UNLOCK();
  return;
}

Assistant:

void MergeSortTree<E, O, CMP, F, C>::BuildRun(idx_t level_idx, idx_t run_idx) {
	//	Create each parent run by merging the child runs using a tournament tree
	// 	https://en.wikipedia.org/wiki/K-way_merge_algorithm
	const auto fanout = F;
	const auto cascading = C;

	auto &elements = tree[level_idx].first;
	auto &cascades = tree[level_idx].second;
	const auto &child_level = tree[level_idx - 1];
	const auto count = elements.size();

	idx_t child_run_length = 1;
	auto run_length = child_run_length * fanout;
	for (idx_t l = 1; l < level_idx; ++l) {
		child_run_length = run_length;
		run_length *= fanout;
	}

	const RunElement SENTINEL(MergeSortTraits<ElementType>::SENTINEL(), MergeSortTraits<idx_t>::SENTINEL());

	//	Position markers for scanning the children.
	using Bounds = pair<OffsetType, OffsetType>;
	array<Bounds, fanout> bounds;
	//	Start with first element of each (sorted) child run
	RunElements players;
	const auto child_base = run_idx * run_length;
	for (idx_t child_run = 0; child_run < fanout; ++child_run) {
		const auto child_idx = child_base + child_run * child_run_length;
		bounds[child_run] = {OffsetType(MinValue<idx_t>(child_idx, count)),
		                     OffsetType(MinValue<idx_t>(child_idx + child_run_length, count))};
		if (bounds[child_run].first != bounds[child_run].second) {
			players[child_run] = {child_level.first[child_idx], child_run};
		} else {
			//	Empty child
			players[child_run] = SENTINEL;
		}
	}

	//	Play the first round and extract the winner
	Games games;
	auto element_idx = child_base;
	auto cascade_idx = fanout * run_idx * (run_length / cascading + 2);
	auto winner = StartGames(games, players, SENTINEL);
	while (winner != SENTINEL) {
		// Add fractional cascading pointers
		// if we are on a fraction boundary
		if (!cascades.empty() && element_idx % cascading == 0) {
			for (idx_t i = 0; i < fanout; ++i) {
				cascades[cascade_idx++] = bounds[i].first;
			}
		}

		//	Insert new winner element into the current run
		elements[element_idx++] = winner.first;
		const auto child_run = winner.second;
		auto &child_idx = bounds[child_run].first;
		++child_idx;

		//	Move to the next entry in the child run (if any)
		if (child_idx < bounds[child_run].second) {
			winner = ReplayGames(games, child_run, {child_level.first[child_idx], child_run});
		} else {
			winner = ReplayGames(games, child_run, SENTINEL);
		}
	}

	// Add terminal cascade pointers to the end
	if (!cascades.empty()) {
		for (idx_t j = 0; j < 2; ++j) {
			for (idx_t i = 0; i < fanout; ++i) {
				cascades[cascade_idx++] = bounds[i].first;
			}
		}
	}

	++build_complete;
}